

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O3

void __thiscall
TPZSBMatrix<double>::TPZSBMatrix(TPZSBMatrix<double> *this,void **vtt,int64_t dim,int64_t band)

{
  _func_int **pp_Var1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[3];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[2];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)vtt[1];
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = dim;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = dim;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  pp_Var1 = (_func_int **)*vtt;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = pp_Var1;
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  lVar3 = dim + -1;
  if (band <= dim + -1) {
    lVar3 = band;
  }
  this->fBand = lVar3;
  iVar2 = (*pp_Var1[0x4b])(this);
  (*(this->fDiag)._vptr_TPZVec[3])(&this->fDiag,CONCAT44(extraout_var,iVar2));
  (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])
            (this);
  return;
}

Assistant:

TPZSBMatrix<TVar>::TPZSBMatrix( int64_t dim, int64_t band )
: TPZRegisterClassId(&TPZSBMatrix::ClassId),
TPZMatrix<TVar>( dim, dim )
{
    fBand = ( band > (dim - 1) ? (dim - 1) : band );
    fDiag.resize(Size());
    
    Zero();
}